

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

LabelSymbol * __thiscall PcodeCompile::defineLabel(PcodeCompile *this,string *name)

{
  uint4 uVar1;
  pointer pcVar2;
  LabelSymbol *this_00;
  
  this_00 = (LabelSymbol *)operator_new(0x40);
  uVar1 = this->local_labelcount;
  this->local_labelcount = uVar1 + 1;
  SleighSymbol::SleighSymbol((SleighSymbol *)this_00,name);
  (this_00->super_SleighSymbol)._vptr_SleighSymbol = (_func_int **)&PTR__SleighSymbol_003ce458;
  this_00->index = uVar1;
  this_00->refcount = 0;
  this_00->isplaced = false;
  pcVar2 = (name->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &name->field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(name);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  return this_00;
}

Assistant:

LabelSymbol *PcodeCompile::defineLabel(string *name)

{ // Create a label symbol
  LabelSymbol *labsym = new LabelSymbol(*name,local_labelcount++);
  delete name;
  addSymbol(labsym);		// Add symbol to local scope
  return labsym;
}